

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O2

tchar SkipWhite(TidyConfigImpl *config)

{
  Bool BVar1;
  uint c;
  
  c = config->c;
  while( true ) {
    BVar1 = prvTidyIsWhite(c);
    if (BVar1 == no) break;
    BVar1 = prvTidyIsNewline(config->c);
    if (BVar1 != no) break;
    c = GetC(config);
    config->c = c;
  }
  return config->c;
}

Assistant:

static tchar SkipWhite( TidyConfigImpl* config )
{
    while ( TY_(IsWhite)(config->c) && !TY_(IsNewline)(config->c) )
        config->c = GetC( config );
    return config->c;
}